

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O1

int run_test_tcp_close_after_read_timeout(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 *extraout_RDX;
  uv_stream_t *server;
  int64_t eval_b_1;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  undefined8 uStack_128;
  undefined1 auStack_120 [16];
  uv_close_cb local_110;
  uv_close_cb local_108 [2];
  uv__queue *local_f8;
  sockaddr_in local_f0;
  uv_tcp_t local_e0;
  
  auStack_120._0_8_ = (void *)0x1c4af6;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  local_e0.data = (void *)(long)iVar1;
  local_108[0] = (uv_close_cb)0x0;
  if (local_e0.data == (void *)0x0) {
    auStack_120._0_8_ = (void *)0x1c4b1b;
    loop = uv_default_loop();
    auStack_120._0_8_ = (void *)0x1c4b34;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_108);
    local_e0.data = (void *)(long)iVar1;
    local_110 = (uv_close_cb)0x0;
    if (local_e0.data != (void *)0x0) goto LAB_001c4dde;
    auStack_120._0_8_ = (void *)0x1c4b61;
    iVar1 = uv_tcp_init(loop,&local_e0);
    local_110 = (uv_close_cb)(long)iVar1;
    local_f8 = (uv__queue *)0x0;
    if (local_110 != (uv_close_cb)0x0) goto LAB_001c4ded;
    auStack_120._0_8_ = (void *)0x1c4b92;
    iVar1 = uv_tcp_bind(&local_e0,(sockaddr *)local_108,0);
    local_110 = (uv_close_cb)(long)iVar1;
    local_f8 = (uv__queue *)0x0;
    if (local_110 != (uv_close_cb)0x0) goto LAB_001c4dfc;
    auStack_120._0_8_ = (void *)0x1c4bc8;
    iVar1 = uv_listen((uv_stream_t *)&local_e0,0x80,on_connection);
    local_110 = (uv_close_cb)(long)iVar1;
    local_f8 = (uv__queue *)0x0;
    if (local_110 != (uv_close_cb)0x0) goto LAB_001c4e0b;
    auStack_120._0_8_ = (void *)0x1c4bf2;
    uv_unref((uv_handle_t *)&local_e0);
    auStack_120._0_8_ = (void *)0x1c4c01;
    iVar1 = uv_tcp_init(loop,&client);
    local_108[0] = (uv_close_cb)(long)iVar1;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e1a;
    auStack_120._0_8_ = (void *)0x1c4c40;
    iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&local_f0,on_client_connect);
    local_108[0] = (uv_close_cb)(long)iVar1;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e29;
    auStack_120._0_8_ = (void *)0x1c4c6f;
    iVar1 = uv_tcp_init(loop,&connection);
    local_108[0] = (uv_close_cb)(long)iVar1;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e38;
    auStack_120._0_8_ = (void *)0x1c4c9e;
    iVar1 = uv_timer_init(loop,&timer);
    local_108[0] = (uv_close_cb)(long)iVar1;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e47;
    local_108[0] = (uv_close_cb)(long)read_cb_called;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e56;
    local_108[0] = (uv_close_cb)(long)on_close_called;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e65;
    auStack_120._0_8_ = (void *)0x1c4d12;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_108[0] = (uv_close_cb)(long)iVar1;
    local_110 = (uv_close_cb)0x0;
    if (local_108[0] != (uv_close_cb)0x0) goto LAB_001c4e74;
    local_108[0] = (uv_close_cb)0x1;
    local_110 = (uv_close_cb)(long)read_cb_called;
    if (local_110 != (uv_close_cb)0x1) goto LAB_001c4e83;
    local_108[0] = (uv_close_cb)0x3;
    local_110 = (uv_close_cb)(long)on_close_called;
    if (local_110 != (uv_close_cb)0x3) goto LAB_001c4e92;
    auStack_120._0_8_ = (void *)0x1c4d8d;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStack_120._0_8_ = (void *)0x1c4d97;
    uv_run(loop,UV_RUN_DEFAULT);
    local_108[0] = (uv_close_cb)0x0;
    auStack_120._0_8_ = (void *)0x1c4da8;
    iVar1 = uv_loop_close(loop);
    local_110 = (uv_close_cb)(long)iVar1;
    if (local_108[0] == local_110) {
      auStack_120._0_8_ = (void *)0x1c4dc4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_120._0_8_ = (void *)0x1c4dde;
    run_test_tcp_close_after_read_timeout_cold_1();
LAB_001c4dde:
    auStack_120._0_8_ = (void *)0x1c4ded;
    run_test_tcp_close_after_read_timeout_cold_2();
LAB_001c4ded:
    auStack_120._0_8_ = (void *)0x1c4dfc;
    run_test_tcp_close_after_read_timeout_cold_3();
LAB_001c4dfc:
    auStack_120._0_8_ = (void *)0x1c4e0b;
    run_test_tcp_close_after_read_timeout_cold_4();
LAB_001c4e0b:
    auStack_120._0_8_ = (void *)0x1c4e1a;
    run_test_tcp_close_after_read_timeout_cold_5();
LAB_001c4e1a:
    auStack_120._0_8_ = (void *)0x1c4e29;
    run_test_tcp_close_after_read_timeout_cold_6();
LAB_001c4e29:
    auStack_120._0_8_ = (void *)0x1c4e38;
    run_test_tcp_close_after_read_timeout_cold_7();
LAB_001c4e38:
    auStack_120._0_8_ = (void *)0x1c4e47;
    run_test_tcp_close_after_read_timeout_cold_8();
LAB_001c4e47:
    auStack_120._0_8_ = (void *)0x1c4e56;
    run_test_tcp_close_after_read_timeout_cold_9();
LAB_001c4e56:
    auStack_120._0_8_ = (void *)0x1c4e65;
    run_test_tcp_close_after_read_timeout_cold_10();
LAB_001c4e65:
    auStack_120._0_8_ = (void *)0x1c4e74;
    run_test_tcp_close_after_read_timeout_cold_11();
LAB_001c4e74:
    auStack_120._0_8_ = (void *)0x1c4e83;
    run_test_tcp_close_after_read_timeout_cold_12();
LAB_001c4e83:
    auStack_120._0_8_ = (void *)0x1c4e92;
    run_test_tcp_close_after_read_timeout_cold_13();
LAB_001c4e92:
    auStack_120._0_8_ = (void *)0x1c4ea1;
    run_test_tcp_close_after_read_timeout_cold_14();
  }
  auStack_120._0_8_ = on_client_connect;
  run_test_tcp_close_after_read_timeout_cold_15();
  iVar1 = uv_read_start((uv_stream_t *)&client,on_client_alloc,on_client_read);
  auStack_120._0_8_ = SEXT48(iVar1);
  uStack_128 = 0;
  if ((void *)auStack_120._0_8_ == (void *)0x0) {
    iVar1 = uv_timer_start(&timer,on_client_timeout,1000,0);
    auStack_120._0_8_ = SEXT48(iVar1);
    uStack_128 = 0;
    if ((void *)auStack_120._0_8_ == (void *)0x0) {
      return iVar1;
    }
  }
  else {
    on_client_connect_cold_1();
  }
  server = (uv_stream_t *)auStack_120;
  iVar1 = (int)&uStack_128;
  on_client_connect_cold_2();
  if (iVar1 == 0) {
    iVar1 = uv_accept(server,(uv_stream_t *)&connection);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)&connection,on_connection_alloc,on_connection_read);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001c4fe5;
    }
  }
  else {
    on_connection_cold_1();
  }
  on_connection_cold_2();
LAB_001c4fe5:
  on_connection_cold_3();
  *extraout_RDX = on_connection_alloc::slab;
  extraout_RDX[1] = 8;
  return 0x398d78;
}

Assistant:

TEST_IMPL(tcp_close_after_read_timeout) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     on_client_connect);
  ASSERT_OK(r);

  r = uv_tcp_init(loop, &connection);
  ASSERT_OK(r);

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  ASSERT_OK(read_cb_called);
  ASSERT_OK(on_close_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(3, on_close_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}